

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenu::showTearOffMenu(QMenu *this,QPoint *pos)

{
  long lVar1;
  int *piVar2;
  QObject *this_00;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((*(long *)(lVar1 + 0x318) == 0) || (*(int *)(*(long *)(lVar1 + 0x318) + 4) == 0)) ||
     (*(long *)(lVar1 + 800) == 0)) {
    this_00 = (QObject *)operator_new(0x28);
    QTornOffMenu::QTornOffMenu((QTornOffMenu *)this_00,this);
    uVar3 = QtSharedPointer::ExternalRefCountData::getAndRef(this_00);
    piVar2 = *(int **)(lVar1 + 0x318);
    *(undefined8 *)(lVar1 + 0x318) = uVar3;
    *(QObject **)(lVar1 + 800) = this_00;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        operator_delete(piVar2);
      }
    }
  }
  uVar3 = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  local_38.x1.m_i = (pos->xp).m_i;
  local_38.x2.m_i = (int)uVar3 + local_38.x1.m_i + -1;
  local_38.y1.m_i = (pos->yp).m_i;
  local_38.y2.m_i = (int)((ulong)uVar3 >> 0x20) + local_38.y1.m_i + -1;
  QWidget::setGeometry(*(QWidget **)(lVar1 + 800),&local_38);
  QWidget::show(*(QWidget **)(lVar1 + 800));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::showTearOffMenu(const QPoint &pos)
{
    Q_D(QMenu);
    if (!d->tornPopup)
        d->tornPopup = new QTornOffMenu(this);
    const QSize &s = sizeHint();
    d->tornPopup->setGeometry(pos.x(), pos.y(), s.width(), s.height());
    d->tornPopup->show();
}